

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O3

int phosg::lstat(char *__file,stat *__buf)

{
  int iVar1;
  cannot_stat_file *this;
  
  iVar1 = ::lstat((char *)__buf->st_dev,(stat *)__file);
  if (iVar1 == 0) {
    return (int)__file;
  }
  this = (cannot_stat_file *)__cxa_allocate_exception(0x20);
  cannot_stat_file::cannot_stat_file(this,(string *)__buf);
  __cxa_throw(this,&cannot_stat_file::typeinfo,cannot_stat_file::~cannot_stat_file);
}

Assistant:

struct stat lstat(const string& filename) {
  struct stat st;
  if (::lstat(filename.c_str(), &st)) {
    throw cannot_stat_file(filename);
  }
  return st;
}